

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void __thiscall
duckdb::AggregateExecutor::
UnaryUpdate<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
          (AggregateExecutor *this,Vector *input,AggregateInputData *aggr_input_data,
          data_ptr_t state,idx_t count)

{
  undefined8 *puVar1;
  long lVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t *piVar7;
  data_ptr_t pdVar8;
  data_ptr_t pdVar9;
  ulong uVar10;
  FunctionData *pFVar11;
  interval_t iVar12;
  interval_t input_00;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if (*this == (AggregateExecutor)0x0) {
    lVar2 = *(long *)(this + 0x20);
    FlatVector::VerifyFlatVector((Vector *)this);
    if ((data_ptr_t)0x3f < state + 0x3f) {
      uVar5 = 0;
      pdVar9 = (data_ptr_t)0x0;
      do {
        if (*(long *)(this + 0x28) == 0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = *(ulong *)(*(long *)(this + 0x28) + uVar5 * 8);
        }
        pdVar4 = pdVar9 + 0x40;
        if (state <= pdVar9 + 0x40) {
          pdVar4 = state;
        }
        pdVar8 = pdVar4;
        if (uVar10 != 0) {
          pdVar8 = pdVar9;
          if (uVar10 == 0xffffffffffffffff) {
            if (pdVar9 < pdVar4) {
              pFVar11 = (aggr_input_data->bind_data).ptr;
              iVar12 = *(interval_t *)&aggr_input_data->allocator;
              piVar7 = (int64_t *)((long)pdVar9 * 0x10 + lVar2 + 8);
              do {
                pFVar11 = (FunctionData *)((long)&pFVar11->_vptr_FunctionData + 1);
                (aggr_input_data->bind_data).ptr = pFVar11;
                right.micros = *piVar7;
                right._0_8_ = piVar7[-1];
                iVar12 = AddOperator::
                         Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                                   (iVar12,right);
                *(interval_t *)&aggr_input_data->allocator = iVar12;
                pdVar8 = pdVar8 + 1;
                piVar7 = piVar7 + 2;
              } while (pdVar4 != pdVar8);
            }
          }
          else if (pdVar9 < pdVar4) {
            piVar7 = (int64_t *)((long)pdVar9 * 0x10 + lVar2 + 8);
            uVar6 = 0;
            do {
              if ((uVar10 >> (uVar6 & 0x3f) & 1) != 0) {
                (aggr_input_data->bind_data).ptr =
                     (FunctionData *)
                     ((long)&((aggr_input_data->bind_data).ptr)->_vptr_FunctionData + 1);
                iVar12.micros = *piVar7;
                iVar12._0_8_ = piVar7[-1];
                iVar12 = AddOperator::
                         Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                                   (*(interval_t *)&aggr_input_data->allocator,iVar12);
                *(interval_t *)&aggr_input_data->allocator = iVar12;
              }
              uVar6 = uVar6 + 1;
              piVar7 = piVar7 + 2;
            } while (pdVar9 + (uVar6 - (long)pdVar4) != (data_ptr_t)0x0);
            pdVar8 = pdVar9 + uVar6;
          }
        }
        uVar5 = uVar5 + 1;
        pdVar9 = pdVar8;
      } while (uVar5 != (ulong)(state + 0x3f) >> 6);
    }
  }
  else if (*this == (AggregateExecutor)0x2) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      (aggr_input_data->bind_data).ptr =
           (FunctionData *)(state + (long)(aggr_input_data->bind_data).ptr);
      input_00.micros = (int64_t)state;
      input_00._0_8_ = puVar1[1];
      IntervalAdd::AddConstant<duckdb::IntervalAvgState,duckdb::interval_t>
                ((IntervalAdd *)aggr_input_data,(IntervalAvgState *)*puVar1,input_00,count);
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat((Vector *)this,(idx_t)state,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (state != (data_ptr_t)0x0) {
        psVar3 = (local_78.sel)->sel_vector;
        pFVar11 = (aggr_input_data->bind_data).ptr;
        iVar12 = *(interval_t *)&aggr_input_data->allocator;
        pdVar9 = (data_ptr_t)0x0;
        do {
          pdVar4 = pdVar9;
          if (psVar3 != (sel_t *)0x0) {
            pdVar4 = (data_ptr_t)(ulong)psVar3[(long)pdVar9];
          }
          (aggr_input_data->bind_data).ptr =
               (FunctionData *)(pdVar9 + (long)((long)&pFVar11->_vptr_FunctionData + 1));
          right_01.micros = *(int64_t *)(local_78.data + (long)pdVar4 * 0x10 + 8);
          right_01._0_8_ = *(undefined8 *)(local_78.data + (long)pdVar4 * 0x10);
          iVar12 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                             (iVar12,right_01);
          *(interval_t *)&aggr_input_data->allocator = iVar12;
          pdVar9 = pdVar9 + 1;
        } while (state != pdVar9);
      }
    }
    else if (state != (data_ptr_t)0x0) {
      psVar3 = (local_78.sel)->sel_vector;
      pdVar9 = (data_ptr_t)0x0;
      do {
        pdVar4 = pdVar9;
        if (psVar3 != (sel_t *)0x0) {
          pdVar4 = (data_ptr_t)(ulong)psVar3[(long)pdVar9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)pdVar4 >> 6] >> ((ulong)pdVar4 & 0x3f) & 1) != 0)) {
          (aggr_input_data->bind_data).ptr =
               (FunctionData *)((long)&((aggr_input_data->bind_data).ptr)->_vptr_FunctionData + 1);
          right_00.micros = *(int64_t *)(local_78.data + (long)pdVar4 * 0x10 + 8);
          right_00._0_8_ = *(undefined8 *)(local_78.data + (long)pdVar4 * 0x10);
          iVar12 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                             (*(interval_t *)&aggr_input_data->allocator,right_00);
          *(interval_t *)&aggr_input_data->allocator = iVar12;
        }
        pdVar9 = pdVar9 + 1;
      } while (state != pdVar9);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}